

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_test.cpp
# Opt level: O2

void __thiscall vm_test_disassemble_bad_Test::TestBody(vm_test_disassemble_bad_Test *this)

{
  allocator_type *paVar1;
  vm1_type *this_00;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  allocator_type local_4b;
  uchar local_4a [2];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  instr_set_type *local_28;
  pointer puStack_20;
  pointer local_18;
  
  local_4a[0] = 8;
  paVar1 = &local_4b;
  __l._M_len = 1;
  __l._M_array = local_4a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,__l,paVar1);
  this_00 = &(this->super_vm_test).vm1;
  local_28 = (instr_set_type *)local_48._M_impl.super__Vector_impl_data._M_start;
  puStack_20 = (pointer)local_48._M_impl.super__Vector_impl_data._M_finish;
  local_18 = (pointer)local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (anonymous_namespace)::vm_test::
  check_diassembler_nok<mvm::vm<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>>
            ((vm_test *)this_00,
             (vm<mvm::test::test_instr_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
              *)&stack0xffffffffffffffd8,(prog_chunk *)0x5,(status_type)paVar1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffd8
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  local_4a[0] = '\x01';
  local_4a[1] = '\x01';
  paVar1 = &local_4b;
  __l_00._M_len = 2;
  __l_00._M_array = local_4a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,__l_00,paVar1);
  local_28 = (instr_set_type *)local_48._M_impl.super__Vector_impl_data._M_start;
  puStack_20 = (pointer)local_48._M_impl.super__Vector_impl_data._M_finish;
  local_18 = (pointer)local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (anonymous_namespace)::vm_test::
  check_diassembler_nok<mvm::vm<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>>
            ((vm_test *)this_00,
             (vm<mvm::test::test_instr_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
              *)&stack0xffffffffffffffd8,(prog_chunk *)0x6,(status_type)paVar1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffd8
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

TEST_F(vm_test, disassemble_bad) {
  check_diassembler_nok(vm1, prog_chunk({0x8}),
                        status_type::INVALID_INSTR_OPCODE);
  check_diassembler_nok(vm1, prog_chunk({0x1, 0x1}),
                        status_type::CODE_OVERFLOW);
}